

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int JsUtil::
    BaseDictionary<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*),_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::GetNextFreeEntryIndex(EntryType *freeEntry)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  EntryType *freeEntry_local;
  
  bVar2 = IsFreeEntry(freeEntry);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x32a,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return -2 - (freeEntry->
              super_DefaultHashedEntry<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*),_JsUtil::(anonymous_namespace)::KeyValueEntry>
              ).
              super_KeyValueEntry<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*)>
              .
              super_ValueEntry<bool_(*)(const_std::type_info_*,_bool,_void_*),_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*)>_>
              .
              super_KeyValueEntryDataLayout2<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*)>
              .next;
}

Assistant:

static int GetNextFreeEntryIndex(const EntryType &freeEntry)
        {
            Assert(IsFreeEntry(freeEntry));
            return FreeListSentinel - freeEntry.next;
        }